

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_mesh * rf_gen_mesh_cubicmap
                    (rf_mesh *__return_storage_ptr__,rf_image cubicmap,rf_vec3 cube_size,
                    rf_allocator allocator,rf_allocator temp_allocator)

{
  rf_source_location rVar1;
  rf_source_location rVar2;
  rf_source_location rVar3;
  rf_source_location rVar4;
  rf_allocator_args rVar5;
  rf_allocator allocator_00;
  undefined1 auVar6 [24];
  undefined1 auVar7 [24];
  undefined1 auVar8 [24];
  float fVar9;
  float fVar10;
  int iVar11;
  uint *puVar12;
  rf_color *prVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined8 *puVar17;
  ulong *puVar18;
  float *pfVar19;
  rf_allocator_proc *prVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  rf_mesh *mesh;
  long local_498;
  rf_int i_2;
  rf_int i_1;
  rf_int i;
  int f_counter;
  uint uStack_464;
  uint uStack_434;
  uint uStack_404;
  rf_vec3 v8;
  rf_vec3 v7;
  rf_vec3 v6;
  rf_vec3 v5;
  rf_vec3 v4;
  rf_vec3 v3;
  rf_vec3 v2;
  rf_vec3 v1;
  rf_int x;
  rf_int z;
  rf_recf bottom_tex_uv;
  rf_recf top_tex_uv;
  rf_recf back_tex_uv;
  rf_recf front_tex_uv;
  rf_recf left_tex_uv;
  rf_recf right_tex_uv;
  rf_vec3 n6;
  rf_vec3 n5;
  rf_vec3 n4;
  rf_vec3 n3;
  rf_vec3 n2;
  rf_vec3 n1;
  rf_vec3 *map_normals;
  rf_vec2 *map_texcoords;
  rf_vec3 *map_vertices;
  float h2;
  float h;
  float w;
  int n_counter;
  int vertex_texcoord_counter;
  int vertex_pos_counter;
  int maxTriangles;
  int map_height;
  int map_width;
  rf_color *cubicmap_pixels;
  uint uStack_64;
  void *local_48;
  rf_allocator temp_allocator_local;
  rf_allocator allocator_local;
  float local_14;
  float fStack_10;
  rf_vec3 cube_size_local;
  
  temp_allocator_local.user_data = temp_allocator.allocator_proc;
  local_48 = temp_allocator.user_data;
  prVar20 = allocator.allocator_proc;
  temp_allocator_local.allocator_proc = (rf_allocator_proc *)allocator.user_data;
  fVar37 = cube_size.z;
  memset(__return_storage_ptr__,0,0x70);
  rVar1.proc_name = "rf_gen_mesh_cubicmap";
  rVar1.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar1.line_in_file = 0x898b;
  rVar5._16_8_ = (ulong)uStack_64 << 0x20;
  rVar5.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
  rVar5.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
  puVar12 = (uint *)(*prVar20)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar1,
                               RF_AM_ALLOC,rVar5);
  __return_storage_ptr__->vbo_id = puVar12;
  memset(__return_storage_ptr__->vbo_id,0,0x1c);
  allocator_00.allocator_proc = (rf_allocator_proc *)temp_allocator_local.user_data;
  allocator_00.user_data = local_48;
  prVar13 = rf_image_pixels_to_rgba32(cubicmap,allocator_00);
  n_counter = 0;
  w = 0.0;
  h = 0.0;
  local_14 = cube_size.x;
  fStack_10 = cube_size.y;
  lVar14 = (*(code *)temp_allocator_local.user_data)(&local_48,1);
  lVar15 = (*(code *)temp_allocator_local.user_data)(&local_48,1);
  lVar16 = (*(code *)temp_allocator_local.user_data)(&local_48,1);
  for (x = 0; x < cubicmap.height; x = x + 1) {
    v1.y = 0.0;
    v1.z = 0.0;
    for (; (long)v1._4_8_ < (long)cubicmap.width; v1._4_8_ = v1._4_8_ + 1) {
      fVar21 = local_14 * ((float)(long)v1._4_8_ - 0.5);
      fVar22 = fVar37 * ((float)x - 0.5);
      fVar23 = local_14 * ((float)(long)v1._4_8_ - 0.5);
      fVar24 = fVar37 * ((float)x + 0.5);
      fVar25 = local_14 * ((float)(long)v1._4_8_ + 0.5);
      fVar26 = fVar37 * ((float)x + 0.5);
      fVar27 = local_14 * ((float)(long)v1._4_8_ + 0.5);
      fVar28 = fVar37 * ((float)x - 0.5);
      fVar29 = local_14 * ((float)(long)v1._4_8_ + 0.5);
      fVar30 = fVar37 * ((float)x - 0.5);
      fVar31 = local_14 * ((float)(long)v1._4_8_ - 0.5);
      fVar32 = fVar37 * ((float)x - 0.5);
      fVar33 = local_14 * ((float)(long)v1._4_8_ - 0.5);
      fVar34 = fVar37 * ((float)x + 0.5);
      fVar35 = local_14 * ((float)(long)v1._4_8_ + 0.5);
      fVar36 = fVar37 * ((float)x + 0.5);
      if (((prVar13[x * cubicmap.width + v1._4_8_].r == 0xff) &&
          (prVar13[x * cubicmap.width + v1._4_8_].g == 0xff)) &&
         (prVar13[x * cubicmap.width + v1._4_8_].b == 0xff)) {
        puVar17 = (undefined8 *)(lVar14 + (long)n_counter * 0xc);
        *puVar17 = CONCAT44(fStack_10,fVar21);
        *(float *)(puVar17 + 1) = fVar22;
        puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 1) * 0xc);
        *puVar17 = CONCAT44(fStack_10,fVar23);
        *(float *)(puVar17 + 1) = fVar24;
        puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 2) * 0xc);
        *puVar17 = CONCAT44(fStack_10,fVar25);
        *(float *)(puVar17 + 1) = fVar26;
        puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 3) * 0xc);
        *puVar17 = CONCAT44(fStack_10,fVar21);
        *(float *)(puVar17 + 1) = fVar22;
        puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 4) * 0xc);
        *puVar17 = CONCAT44(fStack_10,fVar25);
        *(float *)(puVar17 + 1) = fVar26;
        puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 5) * 0xc);
        *puVar17 = CONCAT44(fStack_10,fVar27);
        *(float *)(puVar17 + 1) = fVar28;
        puVar17 = (undefined8 *)(lVar16 + (long)(int)h * 0xc);
        *puVar17 = 0x3f80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 1) * 0xc);
        *puVar17 = 0x3f80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 2) * 0xc);
        *puVar17 = 0x3f80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 3) * 0xc);
        *puVar17 = 0x3f80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 4) * 0xc);
        *puVar17 = 0x3f80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 5) * 0xc);
        *puVar17 = 0x3f80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        *(undefined8 *)(lVar15 + (long)(int)w * 8) = 0x3f00000000000000;
        *(undefined8 *)(lVar15 + (long)((int)w + 1) * 8) = 0x3f80000000000000;
        *(undefined8 *)(lVar15 + (long)((int)w + 2) * 8) = 0x3f8000003f000000;
        *(undefined8 *)(lVar15 + (long)((int)w + 3) * 8) = 0x3f00000000000000;
        *(undefined8 *)(lVar15 + (long)((int)w + 4) * 8) = 0x3f8000003f000000;
        *(undefined8 *)(lVar15 + (long)((int)w + 5) * 8) = 0x3f0000003f000000;
        puVar18 = (ulong *)(lVar14 + (long)(n_counter + 6) * 0xc);
        *puVar18 = (ulong)(uint)fVar31;
        *(float *)(puVar18 + 1) = fVar32;
        puVar18 = (ulong *)(lVar14 + (long)(n_counter + 7) * 0xc);
        *puVar18 = (ulong)(uint)fVar35;
        *(float *)(puVar18 + 1) = fVar36;
        puVar18 = (ulong *)(lVar14 + (long)(n_counter + 8) * 0xc);
        *puVar18 = (ulong)(uint)fVar33;
        *(float *)(puVar18 + 1) = fVar34;
        puVar18 = (ulong *)(lVar14 + (long)(n_counter + 9) * 0xc);
        *puVar18 = (ulong)(uint)fVar31;
        *(float *)(puVar18 + 1) = fVar32;
        puVar18 = (ulong *)(lVar14 + (long)(n_counter + 10) * 0xc);
        *puVar18 = (ulong)(uint)fVar29;
        *(float *)(puVar18 + 1) = fVar30;
        puVar18 = (ulong *)(lVar14 + (long)(n_counter + 0xb) * 0xc);
        *puVar18 = (ulong)(uint)fVar35;
        *(float *)(puVar18 + 1) = fVar36;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 6) * 0xc);
        *puVar17 = 0xbf80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 7) * 0xc);
        *puVar17 = 0xbf80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 8) * 0xc);
        *puVar17 = 0xbf80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 9) * 0xc);
        *puVar17 = 0xbf80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 10) * 0xc);
        *puVar17 = 0xbf80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 0xb) * 0xc);
        *puVar17 = 0xbf80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        *(undefined8 *)(lVar15 + (long)((int)w + 6) * 8) = 0x3f0000003f800000;
        *(undefined8 *)(lVar15 + (long)((int)w + 7) * 8) = 0x3f8000003f000000;
        *(undefined8 *)(lVar15 + (long)((int)w + 8) * 8) = 0x3f8000003f800000;
        *(undefined8 *)(lVar15 + (long)((int)w + 9) * 8) = 0x3f0000003f800000;
        *(undefined8 *)(lVar15 + (long)((int)w + 10) * 8) = 0x3f0000003f000000;
        *(undefined8 *)(lVar15 + (long)((int)w + 0xb) * 8) = 0x3f8000003f000000;
        if ((((x < cubicmap.height + -1) &&
             (prVar13[(x + 1) * (long)cubicmap.width + v1._4_8_].r == '\0')) &&
            ((prVar13[(x + 1) * (long)cubicmap.width + v1._4_8_].g == '\0' &&
             (prVar13[(x + 1) * (long)cubicmap.width + v1._4_8_].b == '\0')))) ||
           (fVar9 = (float)((int)h + 0xc), fVar10 = (float)((int)w + 0xc), iVar11 = n_counter + 0xc,
           x == cubicmap.height + -1)) {
          puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 0xc) * 0xc);
          *puVar17 = CONCAT44(fStack_10,fVar23);
          *(float *)(puVar17 + 1) = fVar24;
          puVar18 = (ulong *)(lVar14 + (long)(n_counter + 0xd) * 0xc);
          *puVar18 = (ulong)(uint)fVar33;
          *(float *)(puVar18 + 1) = fVar34;
          puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 0xe) * 0xc);
          *puVar17 = CONCAT44(fStack_10,fVar25);
          *(float *)(puVar17 + 1) = fVar26;
          puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 0xf) * 0xc);
          *puVar17 = CONCAT44(fStack_10,fVar25);
          *(float *)(puVar17 + 1) = fVar26;
          puVar18 = (ulong *)(lVar14 + (long)(n_counter + 0x10) * 0xc);
          *puVar18 = (ulong)(uint)fVar33;
          *(float *)(puVar18 + 1) = fVar34;
          puVar18 = (ulong *)(lVar14 + (long)(n_counter + 0x11) * 0xc);
          *puVar18 = (ulong)(uint)fVar35;
          *(float *)(puVar18 + 1) = fVar36;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 0xc) * 0xc);
          *puVar17 = 0;
          *(undefined4 *)(puVar17 + 1) = 0xbf800000;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 0xd) * 0xc);
          *puVar17 = 0;
          *(undefined4 *)(puVar17 + 1) = 0xbf800000;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 0xe) * 0xc);
          *puVar17 = 0;
          *(undefined4 *)(puVar17 + 1) = 0xbf800000;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 0xf) * 0xc);
          *puVar17 = 0;
          *(undefined4 *)(puVar17 + 1) = 0xbf800000;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 0x10) * 0xc);
          *puVar17 = 0;
          *(undefined4 *)(puVar17 + 1) = 0xbf800000;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 0x11) * 0xc);
          *puVar17 = 0;
          *(undefined4 *)(puVar17 + 1) = 0xbf800000;
          *(undefined8 *)(lVar15 + (long)((int)w + 0xc) * 8) = 0;
          *(undefined8 *)(lVar15 + (long)((int)w + 0xd) * 8) = 0x3f00000000000000;
          *(undefined8 *)(lVar15 + (long)((int)w + 0xe) * 8) = 0x3f000000;
          *(undefined8 *)(lVar15 + (long)((int)w + 0xf) * 8) = 0x3f000000;
          *(undefined8 *)(lVar15 + (long)((int)w + 0x10) * 8) = 0x3f00000000000000;
          *(undefined8 *)(lVar15 + (long)((int)w + 0x11) * 8) = 0x3f0000003f000000;
          fVar9 = (float)((int)h + 0x12);
          fVar10 = (float)((int)w + 0x12);
          iVar11 = n_counter + 0x12;
        }
        n_counter = iVar11;
        w = fVar10;
        h = fVar9;
        if (((((0 < x) && (prVar13[(x + -1) * (long)cubicmap.width + v1._4_8_].r == '\0')) &&
             (prVar13[(x + -1) * (long)cubicmap.width + v1._4_8_].g == '\0')) &&
            (prVar13[(x + -1) * (long)cubicmap.width + v1._4_8_].b == '\0')) || (x == 0)) {
          puVar17 = (undefined8 *)(lVar14 + (long)n_counter * 0xc);
          *puVar17 = CONCAT44(fStack_10,fVar21);
          *(float *)(puVar17 + 1) = fVar22;
          puVar18 = (ulong *)(lVar14 + (long)(n_counter + 1) * 0xc);
          *puVar18 = (ulong)(uint)fVar29;
          *(float *)(puVar18 + 1) = fVar30;
          puVar18 = (ulong *)(lVar14 + (long)(n_counter + 2) * 0xc);
          *puVar18 = (ulong)(uint)fVar31;
          *(float *)(puVar18 + 1) = fVar32;
          puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 3) * 0xc);
          *puVar17 = CONCAT44(fStack_10,fVar21);
          *(float *)(puVar17 + 1) = fVar22;
          puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 4) * 0xc);
          *puVar17 = CONCAT44(fStack_10,fVar27);
          *(float *)(puVar17 + 1) = fVar28;
          puVar18 = (ulong *)(lVar14 + (long)(n_counter + 5) * 0xc);
          *puVar18 = (ulong)(uint)fVar29;
          *(float *)(puVar18 + 1) = fVar30;
          n_counter = n_counter + 6;
          puVar17 = (undefined8 *)(lVar16 + (long)(int)h * 0xc);
          *puVar17 = 0;
          *(undefined4 *)(puVar17 + 1) = 0x3f800000;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 1) * 0xc);
          *puVar17 = 0;
          *(undefined4 *)(puVar17 + 1) = 0x3f800000;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 2) * 0xc);
          *puVar17 = 0;
          *(undefined4 *)(puVar17 + 1) = 0x3f800000;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 3) * 0xc);
          *puVar17 = 0;
          *(undefined4 *)(puVar17 + 1) = 0x3f800000;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 4) * 0xc);
          *puVar17 = 0;
          *(undefined4 *)(puVar17 + 1) = 0x3f800000;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 5) * 0xc);
          *puVar17 = 0;
          *(undefined4 *)(puVar17 + 1) = 0x3f800000;
          h = (float)((int)h + 6);
          *(undefined8 *)(lVar15 + (long)(int)w * 8) = 0x3f800000;
          *(undefined8 *)(lVar15 + (long)((int)w + 1) * 8) = 0x3f0000003f000000;
          *(undefined8 *)(lVar15 + (long)((int)w + 2) * 8) = 0x3f0000003f800000;
          *(undefined8 *)(lVar15 + (long)((int)w + 3) * 8) = 0x3f800000;
          *(undefined8 *)(lVar15 + (long)((int)w + 4) * 8) = 0x3f000000;
          *(undefined8 *)(lVar15 + (long)((int)w + 5) * 8) = 0x3f0000003f000000;
          w = (float)((int)w + 6);
        }
        if (((((long)v1._4_8_ < (long)(cubicmap.width + -1)) &&
             (prVar13[x * cubicmap.width + v1._4_8_ + 1].r == '\0')) &&
            ((prVar13[x * cubicmap.width + v1._4_8_ + 1].g == '\0' &&
             (prVar13[x * cubicmap.width + v1._4_8_ + 1].b == '\0')))) ||
           (v1._4_8_ == (long)(cubicmap.width + -1))) {
          puVar17 = (undefined8 *)(lVar14 + (long)n_counter * 0xc);
          *puVar17 = CONCAT44(fStack_10,fVar25);
          *(float *)(puVar17 + 1) = fVar26;
          puVar18 = (ulong *)(lVar14 + (long)(n_counter + 1) * 0xc);
          *puVar18 = (ulong)(uint)fVar35;
          *(float *)(puVar18 + 1) = fVar36;
          puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 2) * 0xc);
          *puVar17 = CONCAT44(fStack_10,fVar27);
          *(float *)(puVar17 + 1) = fVar28;
          puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 3) * 0xc);
          *puVar17 = CONCAT44(fStack_10,fVar27);
          *(float *)(puVar17 + 1) = fVar28;
          puVar18 = (ulong *)(lVar14 + (long)(n_counter + 4) * 0xc);
          *puVar18 = (ulong)(uint)fVar35;
          *(float *)(puVar18 + 1) = fVar36;
          puVar18 = (ulong *)(lVar14 + (long)(n_counter + 5) * 0xc);
          *puVar18 = (ulong)(uint)fVar29;
          *(float *)(puVar18 + 1) = fVar30;
          n_counter = n_counter + 6;
          puVar17 = (undefined8 *)(lVar16 + (long)(int)h * 0xc);
          *puVar17 = 0x3f800000;
          *(undefined4 *)(puVar17 + 1) = 0;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 1) * 0xc);
          *puVar17 = 0x3f800000;
          *(undefined4 *)(puVar17 + 1) = 0;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 2) * 0xc);
          *puVar17 = 0x3f800000;
          *(undefined4 *)(puVar17 + 1) = 0;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 3) * 0xc);
          *puVar17 = 0x3f800000;
          *(undefined4 *)(puVar17 + 1) = 0;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 4) * 0xc);
          *puVar17 = 0x3f800000;
          *(undefined4 *)(puVar17 + 1) = 0;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 5) * 0xc);
          *puVar17 = 0x3f800000;
          *(undefined4 *)(puVar17 + 1) = 0;
          h = (float)((int)h + 6);
          *(undefined8 *)(lVar15 + (long)(int)w * 8) = 0;
          *(undefined8 *)(lVar15 + (long)((int)w + 1) * 8) = 0x3f00000000000000;
          *(undefined8 *)(lVar15 + (long)((int)w + 2) * 8) = 0x3f000000;
          *(undefined8 *)(lVar15 + (long)((int)w + 3) * 8) = 0x3f000000;
          *(undefined8 *)(lVar15 + (long)((int)w + 4) * 8) = 0x3f00000000000000;
          *(undefined8 *)(lVar15 + (long)((int)w + 5) * 8) = 0x3f0000003f000000;
          w = (float)((int)w + 6);
        }
        if ((((0 < (long)v1._4_8_) && (prVar13[x * cubicmap.width + v1._4_8_ + -1].r == '\0')) &&
            ((prVar13[x * cubicmap.width + v1._4_8_ + -1].g == '\0' &&
             (prVar13[x * cubicmap.width + v1._4_8_ + -1].b == '\0')))) || (v1._4_8_ == 0)) {
          puVar17 = (undefined8 *)(lVar14 + (long)n_counter * 0xc);
          *puVar17 = CONCAT44(fStack_10,fVar21);
          *(float *)(puVar17 + 1) = fVar22;
          puVar18 = (ulong *)(lVar14 + (long)(n_counter + 1) * 0xc);
          *puVar18 = (ulong)(uint)fVar33;
          *(float *)(puVar18 + 1) = fVar34;
          puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 2) * 0xc);
          *puVar17 = CONCAT44(fStack_10,fVar23);
          *(float *)(puVar17 + 1) = fVar24;
          puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 3) * 0xc);
          *puVar17 = CONCAT44(fStack_10,fVar21);
          *(float *)(puVar17 + 1) = fVar22;
          puVar18 = (ulong *)(lVar14 + (long)(n_counter + 4) * 0xc);
          *puVar18 = (ulong)(uint)fVar31;
          *(float *)(puVar18 + 1) = fVar32;
          puVar18 = (ulong *)(lVar14 + (long)(n_counter + 5) * 0xc);
          *puVar18 = (ulong)(uint)fVar33;
          *(float *)(puVar18 + 1) = fVar34;
          n_counter = n_counter + 6;
          puVar17 = (undefined8 *)(lVar16 + (long)(int)h * 0xc);
          *puVar17 = 0xbf800000;
          *(undefined4 *)(puVar17 + 1) = 0;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 1) * 0xc);
          *puVar17 = 0xbf800000;
          *(undefined4 *)(puVar17 + 1) = 0;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 2) * 0xc);
          *puVar17 = 0xbf800000;
          *(undefined4 *)(puVar17 + 1) = 0;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 3) * 0xc);
          *puVar17 = 0xbf800000;
          *(undefined4 *)(puVar17 + 1) = 0;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 4) * 0xc);
          *puVar17 = 0xbf800000;
          *(undefined4 *)(puVar17 + 1) = 0;
          puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 5) * 0xc);
          *puVar17 = 0xbf800000;
          *(undefined4 *)(puVar17 + 1) = 0;
          h = (float)((int)h + 6);
          *(undefined8 *)(lVar15 + (long)(int)w * 8) = 0x3f000000;
          *(undefined8 *)(lVar15 + (long)((int)w + 1) * 8) = 0x3f0000003f800000;
          *(undefined8 *)(lVar15 + (long)((int)w + 2) * 8) = 0x3f800000;
          *(undefined8 *)(lVar15 + (long)((int)w + 3) * 8) = 0x3f000000;
          *(undefined8 *)(lVar15 + (long)((int)w + 4) * 8) = 0x3f0000003f000000;
          *(undefined8 *)(lVar15 + (long)((int)w + 5) * 8) = 0x3f0000003f800000;
          w = (float)((int)w + 6);
        }
      }
      else if (((prVar13[x * cubicmap.width + v1._4_8_].r == '\0') &&
               (prVar13[x * cubicmap.width + v1._4_8_].g == '\0')) &&
              (prVar13[x * cubicmap.width + v1._4_8_].b == '\0')) {
        puVar17 = (undefined8 *)(lVar14 + (long)n_counter * 0xc);
        *puVar17 = CONCAT44(fStack_10,fVar21);
        *(float *)(puVar17 + 1) = fVar22;
        puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 1) * 0xc);
        *puVar17 = CONCAT44(fStack_10,fVar25);
        *(float *)(puVar17 + 1) = fVar26;
        puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 2) * 0xc);
        *puVar17 = CONCAT44(fStack_10,fVar23);
        *(float *)(puVar17 + 1) = fVar24;
        puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 3) * 0xc);
        *puVar17 = CONCAT44(fStack_10,fVar21);
        *(float *)(puVar17 + 1) = fVar22;
        puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 4) * 0xc);
        *puVar17 = CONCAT44(fStack_10,fVar27);
        *(float *)(puVar17 + 1) = fVar28;
        puVar17 = (undefined8 *)(lVar14 + (long)(n_counter + 5) * 0xc);
        *puVar17 = CONCAT44(fStack_10,fVar25);
        *(float *)(puVar17 + 1) = fVar26;
        puVar17 = (undefined8 *)(lVar16 + (long)(int)h * 0xc);
        *puVar17 = 0xbf80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 1) * 0xc);
        *puVar17 = 0xbf80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 2) * 0xc);
        *puVar17 = 0xbf80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 3) * 0xc);
        *puVar17 = 0xbf80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 4) * 0xc);
        *puVar17 = 0xbf80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 5) * 0xc);
        *puVar17 = 0xbf80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        *(undefined8 *)(lVar15 + (long)(int)w * 8) = 0x3f00000000000000;
        *(undefined8 *)(lVar15 + (long)((int)w + 1) * 8) = 0x3f8000003f000000;
        *(undefined8 *)(lVar15 + (long)((int)w + 2) * 8) = 0x3f80000000000000;
        *(undefined8 *)(lVar15 + (long)((int)w + 3) * 8) = 0x3f00000000000000;
        *(undefined8 *)(lVar15 + (long)((int)w + 4) * 8) = 0x3f0000003f000000;
        *(undefined8 *)(lVar15 + (long)((int)w + 5) * 8) = 0x3f8000003f000000;
        puVar18 = (ulong *)(lVar14 + (long)(n_counter + 6) * 0xc);
        *puVar18 = (ulong)(uint)fVar31;
        *(float *)(puVar18 + 1) = fVar32;
        puVar18 = (ulong *)(lVar14 + (long)(n_counter + 7) * 0xc);
        *puVar18 = (ulong)(uint)fVar33;
        *(float *)(puVar18 + 1) = fVar34;
        puVar18 = (ulong *)(lVar14 + (long)(n_counter + 8) * 0xc);
        *puVar18 = (ulong)(uint)fVar35;
        *(float *)(puVar18 + 1) = fVar36;
        puVar18 = (ulong *)(lVar14 + (long)(n_counter + 9) * 0xc);
        *puVar18 = (ulong)(uint)fVar31;
        *(float *)(puVar18 + 1) = fVar32;
        puVar18 = (ulong *)(lVar14 + (long)(n_counter + 10) * 0xc);
        *puVar18 = (ulong)(uint)fVar35;
        *(float *)(puVar18 + 1) = fVar36;
        puVar18 = (ulong *)(lVar14 + (long)(n_counter + 0xb) * 0xc);
        *puVar18 = (ulong)(uint)fVar29;
        *(float *)(puVar18 + 1) = fVar30;
        n_counter = n_counter + 0xc;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 6) * 0xc);
        *puVar17 = 0x3f80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 7) * 0xc);
        *puVar17 = 0x3f80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 8) * 0xc);
        *puVar17 = 0x3f80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 9) * 0xc);
        *puVar17 = 0x3f80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 10) * 0xc);
        *puVar17 = 0x3f80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17 = (undefined8 *)(lVar16 + (long)((int)h + 0xb) * 0xc);
        *puVar17 = 0x3f80000000000000;
        *(undefined4 *)(puVar17 + 1) = 0;
        h = (float)((int)h + 0xc);
        *(undefined8 *)(lVar15 + (long)((int)w + 6) * 8) = 0x3f0000003f800000;
        *(undefined8 *)(lVar15 + (long)((int)w + 7) * 8) = 0x3f8000003f800000;
        *(undefined8 *)(lVar15 + (long)((int)w + 8) * 8) = 0x3f8000003f000000;
        *(undefined8 *)(lVar15 + (long)((int)w + 9) * 8) = 0x3f0000003f800000;
        *(undefined8 *)(lVar15 + (long)((int)w + 10) * 8) = 0x3f8000003f000000;
        *(undefined8 *)(lVar15 + (long)((int)w + 0xb) * 8) = 0x3f0000003f000000;
        w = (float)((int)w + 0xc);
      }
    }
  }
  __return_storage_ptr__->vertex_count = n_counter;
  __return_storage_ptr__->triangle_count = n_counter / 3;
  rVar2.proc_name = "rf_gen_mesh_cubicmap";
  rVar2.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar2.line_in_file = 0x8ac1;
  auVar6._8_8_ = (ulong)uStack_404 << 0x20;
  auVar6._0_8_ = (long)(__return_storage_ptr__->vertex_count * 3) << 2;
  auVar6._16_8_ = 0;
  pfVar19 = (float *)(*prVar20)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar2,
                                RF_AM_ALLOC,(rf_allocator_args)(auVar6 << 0x40));
  __return_storage_ptr__->vertices = pfVar19;
  rVar3.proc_name = "rf_gen_mesh_cubicmap";
  rVar3.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar3.line_in_file = 0x8ac2;
  auVar7._8_8_ = (ulong)uStack_434 << 0x20;
  auVar7._0_8_ = (long)(__return_storage_ptr__->vertex_count * 3) << 2;
  auVar7._16_8_ = 0;
  pfVar19 = (float *)(*prVar20)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar3,
                                RF_AM_ALLOC,(rf_allocator_args)(auVar7 << 0x40));
  __return_storage_ptr__->normals = pfVar19;
  rVar4.proc_name = "rf_gen_mesh_cubicmap";
  rVar4.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar4.line_in_file = 0x8ac3;
  auVar8._8_8_ = (ulong)uStack_464 << 0x20;
  auVar8._0_8_ = (long)(__return_storage_ptr__->vertex_count << 1) << 2;
  auVar8._16_8_ = 0;
  pfVar19 = (float *)(*prVar20)((rf_allocator *)&temp_allocator_local.allocator_proc,rVar4,
                                RF_AM_ALLOC,(rf_allocator_args)(auVar8 << 0x40));
  __return_storage_ptr__->texcoords = pfVar19;
  __return_storage_ptr__->colors = (uchar *)0x0;
  i._4_4_ = 0;
  for (i_1 = 0; i_1 < n_counter; i_1 = i_1 + 1) {
    __return_storage_ptr__->vertices[i._4_4_] = *(float *)(lVar14 + i_1 * 0xc);
    __return_storage_ptr__->vertices[i._4_4_ + 1] = *(float *)(lVar14 + i_1 * 0xc + 4);
    __return_storage_ptr__->vertices[i._4_4_ + 2] = *(float *)(lVar14 + i_1 * 0xc + 8);
    i._4_4_ = i._4_4_ + 3;
  }
  i._4_4_ = 0;
  for (i_2 = 0; i_2 < (int)h; i_2 = i_2 + 1) {
    __return_storage_ptr__->normals[i._4_4_] = *(float *)(lVar16 + i_2 * 0xc);
    __return_storage_ptr__->normals[i._4_4_ + 1] = *(float *)(lVar16 + i_2 * 0xc + 4);
    __return_storage_ptr__->normals[i._4_4_ + 2] = *(float *)(lVar16 + i_2 * 0xc + 8);
    i._4_4_ = i._4_4_ + 3;
  }
  i._4_4_ = 0;
  for (local_498 = 0; local_498 < (int)w; local_498 = local_498 + 1) {
    __return_storage_ptr__->texcoords[i._4_4_] = *(float *)(lVar15 + local_498 * 8);
    __return_storage_ptr__->texcoords[i._4_4_ + 1] = *(float *)(lVar15 + 4 + local_498 * 8);
    i._4_4_ = i._4_4_ + 2;
  }
  (*(code *)temp_allocator_local.user_data)(&local_48,3);
  (*(code *)temp_allocator_local.user_data)(&local_48,3);
  (*(code *)temp_allocator_local.user_data)(&local_48,3);
  (*(code *)temp_allocator_local.user_data)(&local_48);
  rf_gfx_load_mesh(__return_storage_ptr__,false);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mesh rf_gen_mesh_cubicmap(rf_image cubicmap, rf_vec3 cube_size, rf_allocator allocator, rf_allocator temp_allocator)
{
    rf_mesh mesh = {0};
    mesh.vbo_id = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO * sizeof(unsigned int));
    memset(mesh.vbo_id, 0, RF_MAX_MESH_VBO * sizeof(unsigned int));

    rf_color* cubicmap_pixels = rf_image_pixels_to_rgba32(cubicmap, temp_allocator);

    int map_width = cubicmap.width;
    int map_height = cubicmap.height;

    // NOTE: Max possible number of triangles numCubes*(12 triangles by cube)
    int maxTriangles = cubicmap.width*cubicmap.height*12;

    int vertex_pos_counter = 0; // Used to count vertices
    int vertex_texcoord_counter = 0; // Used to count texcoords
    int n_counter = 0; // Used to count normals

    float w = cube_size.x;
    float h = cube_size.z;
    float h2 = cube_size.y;

    rf_vec3* map_vertices  = (rf_vec3*) RF_ALLOC(temp_allocator, maxTriangles * 3 * sizeof(rf_vec3));
    rf_vec2 *map_texcoords = (rf_vec2*) RF_ALLOC(temp_allocator, maxTriangles * 3 * sizeof(rf_vec2));
    rf_vec3* map_normals   = (rf_vec3*) RF_ALLOC(temp_allocator, maxTriangles * 3 * sizeof(rf_vec3));

    // Define the 6 normals of the cube, we will combine them accordingly later...
    rf_vec3 n1 = {  1.0f,  0.0f,  0.0f };
    rf_vec3 n2 = { -1.0f,  0.0f,  0.0f };
    rf_vec3 n3 = {  0.0f,  1.0f,  0.0f };
    rf_vec3 n4 = {  0.0f, -1.0f,  0.0f };
    rf_vec3 n5 = {  0.0f,  0.0f,  1.0f };
    rf_vec3 n6 = {  0.0f,  0.0f, -1.0f };

    // NOTE: We use texture rectangles to define different textures for top-bottom-front-back-right-left (6)
    typedef struct rf_recf rf_recf;
    struct rf_recf
    {
        float x;
        float y;
        float width;
        float height;
    };

    rf_recf right_tex_uv  = { 0.0f, 0.0f, 0.5f, 0.5f };
    rf_recf left_tex_uv   = { 0.5f, 0.0f, 0.5f, 0.5f };
    rf_recf front_tex_uv  = { 0.0f, 0.0f, 0.5f, 0.5f };
    rf_recf back_tex_uv   = { 0.5f, 0.0f, 0.5f, 0.5f };
    rf_recf top_tex_uv    = { 0.0f, 0.5f, 0.5f, 0.5f };
    rf_recf bottom_tex_uv = { 0.5f, 0.5f, 0.5f, 0.5f };

    for (rf_int z = 0; z < map_height; ++z)
    {
        for (rf_int x = 0; x < map_width; ++x)
        {
            // Define the 8 vertex of the cube, we will combine them accordingly later...
            rf_vec3 v1 = {w * (x - 0.5f), h2, h * (z - 0.5f) };
            rf_vec3 v2 = {w * (x - 0.5f), h2, h * (z + 0.5f) };
            rf_vec3 v3 = {w * (x + 0.5f), h2, h * (z + 0.5f) };
            rf_vec3 v4 = {w * (x + 0.5f), h2, h * (z - 0.5f) };
            rf_vec3 v5 = {w * (x + 0.5f), 0, h * (z - 0.5f) };
            rf_vec3 v6 = {w * (x - 0.5f), 0, h * (z - 0.5f) };
            rf_vec3 v7 = {w * (x - 0.5f), 0, h * (z + 0.5f) };
            rf_vec3 v8 = {w * (x + 0.5f), 0, h * (z + 0.5f) };

            // We check pixel color to be RF_WHITE, we will full cubes
            if ((cubicmap_pixels[z*cubicmap.width + x].r == 255) &&
                (cubicmap_pixels[z*cubicmap.width + x].g == 255) &&
                (cubicmap_pixels[z*cubicmap.width + x].b == 255))
            {
                // Define triangles (Checking Collateral Cubes!)
                //----------------------------------------------

                // Define top triangles (2 tris, 6 vertex --> v1-v2-v3, v1-v3-v4)
                map_vertices[vertex_pos_counter] = v1;
                map_vertices[vertex_pos_counter + 1] = v2;
                map_vertices[vertex_pos_counter + 2] = v3;
                map_vertices[vertex_pos_counter + 3] = v1;
                map_vertices[vertex_pos_counter + 4] = v3;
                map_vertices[vertex_pos_counter + 5] = v4;
                vertex_pos_counter += 6;

                map_normals[n_counter] = n3;
                map_normals[n_counter + 1] = n3;
                map_normals[n_counter + 2] = n3;
                map_normals[n_counter + 3] = n3;
                map_normals[n_counter + 4] = n3;
                map_normals[n_counter + 5] = n3;
                n_counter += 6;

                map_texcoords[vertex_texcoord_counter] = (rf_vec2){top_tex_uv.x, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){top_tex_uv.x, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){top_tex_uv.x, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y };
                vertex_texcoord_counter += 6;

                // Define bottom triangles (2 tris, 6 vertex --> v6-v8-v7, v6-v5-v8)
                map_vertices[vertex_pos_counter] = v6;
                map_vertices[vertex_pos_counter + 1] = v8;
                map_vertices[vertex_pos_counter + 2] = v7;
                map_vertices[vertex_pos_counter + 3] = v6;
                map_vertices[vertex_pos_counter + 4] = v5;
                map_vertices[vertex_pos_counter + 5] = v8;
                vertex_pos_counter += 6;

                map_normals[n_counter] = n4;
                map_normals[n_counter + 1] = n4;
                map_normals[n_counter + 2] = n4;
                map_normals[n_counter + 3] = n4;
                map_normals[n_counter + 4] = n4;
                map_normals[n_counter + 5] = n4;
                n_counter += 6;

                map_texcoords[vertex_texcoord_counter] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y + bottom_tex_uv.height };
                vertex_texcoord_counter += 6;

                if (((z < cubicmap.height - 1) &&
                     (cubicmap_pixels[(z + 1)*cubicmap.width + x].r == 0) &&
                     (cubicmap_pixels[(z + 1)*cubicmap.width + x].g == 0) &&
                     (cubicmap_pixels[(z + 1)*cubicmap.width + x].b == 0)) || (z == cubicmap.height - 1))
                {
                    // Define front triangles (2 tris, 6 vertex) --> v2 v7 v3, v3 v7 v8
                    // NOTE: Collateral occluded faces are not generated
                    map_vertices[vertex_pos_counter] = v2;
                    map_vertices[vertex_pos_counter + 1] = v7;
                    map_vertices[vertex_pos_counter + 2] = v3;
                    map_vertices[vertex_pos_counter + 3] = v3;
                    map_vertices[vertex_pos_counter + 4] = v7;
                    map_vertices[vertex_pos_counter + 5] = v8;
                    vertex_pos_counter += 6;

                    map_normals[n_counter] = n6;
                    map_normals[n_counter + 1] = n6;
                    map_normals[n_counter + 2] = n6;
                    map_normals[n_counter + 3] = n6;
                    map_normals[n_counter + 4] = n6;
                    map_normals[n_counter + 5] = n6;
                    n_counter += 6;

                    map_texcoords[vertex_texcoord_counter] = (rf_vec2){front_tex_uv.x, front_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){front_tex_uv.x, front_tex_uv.y + front_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){front_tex_uv.x + front_tex_uv.width, front_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){front_tex_uv.x + front_tex_uv.width, front_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){front_tex_uv.x, front_tex_uv.y + front_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){front_tex_uv.x + front_tex_uv.width, front_tex_uv.y + front_tex_uv.height };
                    vertex_texcoord_counter += 6;
                }

                if (((z > 0) &&
                     (cubicmap_pixels[(z - 1)*cubicmap.width + x].r == 0) &&
                     (cubicmap_pixels[(z - 1)*cubicmap.width + x].g == 0) &&
                     (cubicmap_pixels[(z - 1)*cubicmap.width + x].b == 0)) || (z == 0))
                {
                    // Define back triangles (2 tris, 6 vertex) --> v1 v5 v6, v1 v4 v5
                    // NOTE: Collateral occluded faces are not generated
                    map_vertices[vertex_pos_counter] = v1;
                    map_vertices[vertex_pos_counter + 1] = v5;
                    map_vertices[vertex_pos_counter + 2] = v6;
                    map_vertices[vertex_pos_counter + 3] = v1;
                    map_vertices[vertex_pos_counter + 4] = v4;
                    map_vertices[vertex_pos_counter + 5] = v5;
                    vertex_pos_counter += 6;

                    map_normals[n_counter] = n5;
                    map_normals[n_counter + 1] = n5;
                    map_normals[n_counter + 2] = n5;
                    map_normals[n_counter + 3] = n5;
                    map_normals[n_counter + 4] = n5;
                    map_normals[n_counter + 5] = n5;
                    n_counter += 6;

                    map_texcoords[vertex_texcoord_counter] = (rf_vec2){back_tex_uv.x + back_tex_uv.width, back_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){back_tex_uv.x, back_tex_uv.y + back_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){back_tex_uv.x + back_tex_uv.width, back_tex_uv.y + back_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){back_tex_uv.x + back_tex_uv.width, back_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){back_tex_uv.x, back_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){back_tex_uv.x, back_tex_uv.y + back_tex_uv.height };
                    vertex_texcoord_counter += 6;
                }

                if (((x < cubicmap.width - 1) &&
                     (cubicmap_pixels[z*cubicmap.width + (x + 1)].r == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x + 1)].g == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x + 1)].b == 0)) || (x == cubicmap.width - 1))
                {
                    // Define right triangles (2 tris, 6 vertex) --> v3 v8 v4, v4 v8 v5
                    // NOTE: Collateral occluded faces are not generated
                    map_vertices[vertex_pos_counter] = v3;
                    map_vertices[vertex_pos_counter + 1] = v8;
                    map_vertices[vertex_pos_counter + 2] = v4;
                    map_vertices[vertex_pos_counter + 3] = v4;
                    map_vertices[vertex_pos_counter + 4] = v8;
                    map_vertices[vertex_pos_counter + 5] = v5;
                    vertex_pos_counter += 6;

                    map_normals[n_counter] = n1;
                    map_normals[n_counter + 1] = n1;
                    map_normals[n_counter + 2] = n1;
                    map_normals[n_counter + 3] = n1;
                    map_normals[n_counter + 4] = n1;
                    map_normals[n_counter + 5] = n1;
                    n_counter += 6;

                    map_texcoords[vertex_texcoord_counter] = (rf_vec2){right_tex_uv.x, right_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){right_tex_uv.x, right_tex_uv.y + right_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){right_tex_uv.x + right_tex_uv.width, right_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){right_tex_uv.x + right_tex_uv.width, right_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){right_tex_uv.x, right_tex_uv.y + right_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){right_tex_uv.x + right_tex_uv.width, right_tex_uv.y + right_tex_uv.height };
                    vertex_texcoord_counter += 6;
                }

                if (((x > 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x - 1)].r == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x - 1)].g == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x - 1)].b == 0)) || (x == 0))
                {
                    // Define left triangles (2 tris, 6 vertex) --> v1 v7 v2, v1 v6 v7
                    // NOTE: Collateral occluded faces are not generated
                    map_vertices[vertex_pos_counter] = v1;
                    map_vertices[vertex_pos_counter + 1] = v7;
                    map_vertices[vertex_pos_counter + 2] = v2;
                    map_vertices[vertex_pos_counter + 3] = v1;
                    map_vertices[vertex_pos_counter + 4] = v6;
                    map_vertices[vertex_pos_counter + 5] = v7;
                    vertex_pos_counter += 6;

                    map_normals[n_counter] = n2;
                    map_normals[n_counter + 1] = n2;
                    map_normals[n_counter + 2] = n2;
                    map_normals[n_counter + 3] = n2;
                    map_normals[n_counter + 4] = n2;
                    map_normals[n_counter + 5] = n2;
                    n_counter += 6;

                    map_texcoords[vertex_texcoord_counter] = (rf_vec2){left_tex_uv.x, left_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){left_tex_uv.x + left_tex_uv.width, left_tex_uv.y + left_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){left_tex_uv.x + left_tex_uv.width, left_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){left_tex_uv.x, left_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){left_tex_uv.x, left_tex_uv.y + left_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){left_tex_uv.x + left_tex_uv.width, left_tex_uv.y + left_tex_uv.height };
                    vertex_texcoord_counter += 6;
                }
            }
                // We check pixel color to be RF_BLACK, we will only draw floor and roof
            else if ((cubicmap_pixels[z*cubicmap.width + x].r == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + x].g == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + x].b == 0))
            {
                // Define top triangles (2 tris, 6 vertex --> v1-v2-v3, v1-v3-v4)
                map_vertices[vertex_pos_counter] = v1;
                map_vertices[vertex_pos_counter + 1] = v3;
                map_vertices[vertex_pos_counter + 2] = v2;
                map_vertices[vertex_pos_counter + 3] = v1;
                map_vertices[vertex_pos_counter + 4] = v4;
                map_vertices[vertex_pos_counter + 5] = v3;
                vertex_pos_counter += 6;

                map_normals[n_counter] = n4;
                map_normals[n_counter + 1] = n4;
                map_normals[n_counter + 2] = n4;
                map_normals[n_counter + 3] = n4;
                map_normals[n_counter + 4] = n4;
                map_normals[n_counter + 5] = n4;
                n_counter += 6;

                map_texcoords[vertex_texcoord_counter] = (rf_vec2){top_tex_uv.x, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){top_tex_uv.x, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){top_tex_uv.x, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y + top_tex_uv.height };
                vertex_texcoord_counter += 6;

                // Define bottom triangles (2 tris, 6 vertex --> v6-v8-v7, v6-v5-v8)
                map_vertices[vertex_pos_counter] = v6;
                map_vertices[vertex_pos_counter + 1] = v7;
                map_vertices[vertex_pos_counter + 2] = v8;
                map_vertices[vertex_pos_counter + 3] = v6;
                map_vertices[vertex_pos_counter + 4] = v8;
                map_vertices[vertex_pos_counter + 5] = v5;
                vertex_pos_counter += 6;

                map_normals[n_counter] = n3;
                map_normals[n_counter + 1] = n3;
                map_normals[n_counter + 2] = n3;
                map_normals[n_counter + 3] = n3;
                map_normals[n_counter + 4] = n3;
                map_normals[n_counter + 5] = n3;
                n_counter += 6;

                map_texcoords[vertex_texcoord_counter] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y };
                vertex_texcoord_counter += 6;
            }
        }
    }

    // Move data from map_vertices temp arays to vertices float array
    mesh.vertex_count = vertex_pos_counter;
    mesh.triangle_count = vertex_pos_counter/3;

    mesh.vertices  = (float*) RF_ALLOC(allocator, mesh.vertex_count * 3 * sizeof(float));
    mesh.normals   = (float*) RF_ALLOC(allocator, mesh.vertex_count * 3 * sizeof(float));
    mesh.texcoords = (float*) RF_ALLOC(allocator, mesh.vertex_count * 2 * sizeof(float));
    mesh.colors = NULL;

    int f_counter = 0;

    // Move vertices data
    for (rf_int i = 0; i < vertex_pos_counter; i++)
    {
        mesh.vertices[f_counter] = map_vertices[i].x;
        mesh.vertices[f_counter + 1] = map_vertices[i].y;
        mesh.vertices[f_counter + 2] = map_vertices[i].z;
        f_counter += 3;
    }

    f_counter = 0;

    // Move normals data
    for (rf_int i = 0; i < n_counter; i++)
    {
        mesh.normals[f_counter] = map_normals[i].x;
        mesh.normals[f_counter + 1] = map_normals[i].y;
        mesh.normals[f_counter + 2] = map_normals[i].z;
        f_counter += 3;
    }

    f_counter = 0;

    // Move texcoords data
    for (rf_int i = 0; i < vertex_texcoord_counter; i++)
    {
        mesh.texcoords[f_counter] = map_texcoords[i].x;
        mesh.texcoords[f_counter + 1] = map_texcoords[i].y;
        f_counter += 2;
    }

    RF_FREE(temp_allocator, map_vertices);
    RF_FREE(temp_allocator, map_normals);
    RF_FREE(temp_allocator, map_texcoords);

    RF_FREE(temp_allocator, cubicmap_pixels); // Free image pixel data

    // Upload vertex data to GPU (static mesh)
    rf_gfx_load_mesh(&mesh, false);

    return mesh;
}